

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  size_type *psVar1;
  size_type *psVar2;
  size_t sVar3;
  undefined8 *puVar4;
  pointer pcVar5;
  undefined8 uVar6;
  size_type *local_88;
  string file_name;
  long local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  size_type *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int line_local;
  
  __str.field_2._12_4_ = SUB84(file,0);
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_88 = &file_name._M_string_length;
  sVar3 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,this,this + sVar3);
  if ((int)__str.field_2._12_4_ < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_88,file_name._M_dataplus._M_p + (long)local_88
              );
    goto LAB_0014ee91;
  }
  psVar1 = &__str._M_string_length;
  local_48 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,local_88,file_name._M_dataplus._M_p + (long)local_88);
  std::__cxx11::string::append((char *)&local_48);
  StreamableToString<int>
            ((string *)((long)&file_name.field_2 + 8),(int *)(__str.field_2._M_local_buf + 0xc));
  pcVar5 = (pointer)0xf;
  if (local_48 != psVar1) {
    pcVar5 = (pointer)__str._M_string_length;
  }
  if (pcVar5 < __str._M_dataplus._M_p + local_60) {
    uVar6 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)file_name.field_2._8_8_ != &local_58) {
      uVar6 = local_58._M_allocated_capacity;
    }
    if ((ulong)uVar6 < __str._M_dataplus._M_p + local_60) goto LAB_0014edfc;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)((long)&file_name.field_2 + 8),0,(char *)0x0,(ulong)local_48);
  }
  else {
LAB_0014edfc:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_48,file_name.field_2._8_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar2) {
    uVar6 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)file_name.field_2._8_8_ != &local_58) {
    operator_delete((void *)file_name.field_2._8_8_);
  }
  if (local_48 != psVar1) {
    operator_delete(local_48);
  }
LAB_0014ee91:
  if (local_88 != &file_name._M_string_length) {
    operator_delete(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0)
    return file_name;
  else
    return file_name + ":" + StreamableToString(line);
}